

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::CalcWindowNextAutoFitSize(ImGuiWindow *window)

{
  ImVec2 IVar1;
  ImVec2 local_30;
  ImVec2 size_auto_fit;
  ImVec2 size_contents_ideal;
  ImVec2 size_contents_current;
  ImGuiWindow *window_local;
  ImVec2 size_final;
  
  ImVec2::ImVec2(&size_contents_ideal);
  ImVec2::ImVec2(&size_auto_fit);
  CalcWindowContentSizes(window,&size_contents_ideal,&size_auto_fit);
  local_30 = CalcWindowAutoFitSize(window,&size_auto_fit);
  IVar1 = CalcWindowSizeAfterConstraint(window,&local_30);
  return IVar1;
}

Assistant:

ImVec2 ImGui::CalcWindowNextAutoFitSize(ImGuiWindow* window)
{
    ImVec2 size_contents_current;
    ImVec2 size_contents_ideal;
    CalcWindowContentSizes(window, &size_contents_current, &size_contents_ideal);
    ImVec2 size_auto_fit = CalcWindowAutoFitSize(window, size_contents_ideal);
    ImVec2 size_final = CalcWindowSizeAfterConstraint(window, size_auto_fit);
    return size_final;
}